

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonrd_pickmode.c
# Opt level: O1

void calc_rate_dist_block_param
               (AV1_COMP *cpi,MACROBLOCK *x,RD_STATS *rd_stats,int calculate_rd,int *early_term,
               BLOCK_SIZE bsize,uint sse)

{
  tran_low_t *ptVar1;
  int iVar2;
  byte bVar3;
  undefined4 in_register_0000000c;
  tran_low_t *ptVar4;
  int iVar5;
  undefined3 in_register_00000089;
  macroblock_plane *p;
  double dVar6;
  double dVar7;
  double sse_norm;
  double dist_by_sse_norm_f;
  double rate_f;
  double local_40;
  double local_38;
  
  if ((int)rd_stats != 0) {
    if (*(int *)CONCAT44(in_register_0000000c,calculate_rd) == 0) {
      ptVar1 = x->plane[0].coeff;
      bVar3 = 3;
      if ((*(byte *)(*(long *)((cpi->enc_quant_dequant_params).quants.y_zbin[10] + 4) + 0xc0) & 8)
          != 0) {
        bVar3 = (char)*(undefined4 *)(cpi->enc_quant_dequant_params).quants.y_zbin[0xb3] - 5;
      }
      if (ptVar1 == (tran_low_t *)0x0) {
        if (x != (MACROBLOCK *)0x0) {
          *(undefined4 *)&x->plane[0].src_diff = 0;
        }
        x->plane[0].dqcoeff = (tran_low_t *)0x0;
      }
      else {
        iVar5 = (int)*(short *)(*(long *)(cpi->enc_quant_dequant_params).quants.y_quant[7] + 2) >>
                (bVar3 & 0x1f);
        iVar2 = 1;
        if (1 < iVar5) {
          iVar2 = iVar5;
        }
        dVar6 = (double)((uint)block_size_high[(ulong)early_term & 0xff] *
                        (uint)block_size_wide[(ulong)early_term & 0xff]);
        sse_norm = (double)(long)ptVar1 / dVar6;
        dVar7 = log2(sse_norm / ((double)iVar2 * (double)iVar2));
        av1_model_rd_curvfit((BLOCK_SIZE)early_term,sse_norm,dVar7,&local_38,&local_40);
        dVar7 = 0.0;
        if (0.0 <= local_38 * dVar6) {
          dVar7 = local_38 * dVar6;
        }
        iVar2 = (int)(dVar7 + 0.5);
        if (iVar2 == 0) {
          ptVar4 = (tran_low_t *)((long)ptVar1 << 4);
          iVar5 = 0;
        }
        else {
          dVar6 = sse_norm * local_40 * dVar6;
          dVar7 = 0.0;
          if (0.0 <= dVar6) {
            dVar7 = dVar6;
          }
          ptVar4 = (tran_low_t *)((long)ptVar1 << 4);
          iVar5 = 0;
          if ((long)(dVar7 + 0.5) * 0x80 +
              ((long)*(int *)((cpi->enc_quant_dequant_params).quants.y_quant_fp[0x20] + 4) *
               (long)iVar2 + 0x100 >> 9) < (long)ptVar1 * 0x800) {
            ptVar4 = (tran_low_t *)(long)(dVar7 + 0.5);
            iVar5 = iVar2;
          }
        }
        if (x != (MACROBLOCK *)0x0) {
          *(int *)&x->plane[0].src_diff = iVar5;
        }
        x->plane[0].dqcoeff = ptVar4;
      }
    }
    if (*(int *)CONCAT44(in_register_0000000c,calculate_rd) != 0) {
      *(undefined4 *)&x->plane[0].src_diff = 0;
      x->plane[0].dqcoeff = (tran_low_t *)(ulong)(uint)(CONCAT31(in_register_00000089,bsize) << 4);
    }
  }
  return;
}

Assistant:

static inline void calc_rate_dist_block_param(AV1_COMP *cpi, MACROBLOCK *x,
                                              RD_STATS *rd_stats,
                                              int calculate_rd, int *early_term,
                                              BLOCK_SIZE bsize,
                                              unsigned int sse) {
  if (calculate_rd) {
    if (!*early_term) {
      const int bw = block_size_wide[bsize];
      const int bh = block_size_high[bsize];

      model_rd_with_curvfit(cpi, x, bsize, AOM_PLANE_Y, rd_stats->sse, bw * bh,
                            &rd_stats->rate, &rd_stats->dist);
    }

    if (*early_term) {
      rd_stats->rate = 0;
      rd_stats->dist = sse << 4;
    }
  }
}